

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_sw_diag_avx2_256_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int64_t iVar1;
  int *piVar2;
  long lVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int iVar9;
  undefined1 auVar10 [32];
  uint uVar11;
  int iVar12;
  parasail_result_t *ppVar13;
  undefined1 (*ptr) [16];
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar20;
  int64_t iVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  int64_t iVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_220 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  long local_1a0;
  long lStack_198;
  long lStack_190;
  long lStack_188;
  undefined1 local_180 [32];
  long local_160;
  long lStack_158;
  long lStack_150;
  long lStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  long local_e0;
  long lStack_d8;
  long lStack_d0;
  long lStack_c8;
  undefined1 local_c0 [32];
  ulong local_a0;
  ulong uStack_98;
  ulong uStack_90;
  ulong uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  int64_t iVar19;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_diag_avx2_256_64_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_diag_avx2_256_64_cold_6();
  }
  else if (open < 0) {
    parasail_sw_diag_avx2_256_64_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_diag_avx2_256_64_cold_4();
  }
  else {
    uVar38 = (ulong)(uint)_s1Len;
    if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sw_diag_avx2_256_64_cold_3();
    }
    else {
      if (matrix->type == 0) {
        if (_s1 == (char *)0x0) {
          parasail_sw_diag_avx2_256_64_cold_2();
          return (parasail_result_t *)0x0;
        }
        if (_s1Len < 1) {
          parasail_sw_diag_avx2_256_64_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        uVar38 = (ulong)(uint)matrix->length;
      }
      iVar12 = matrix->min;
      uVar14 = 0x8000000000000000 - (long)iVar12;
      if (iVar12 != -open && SBORROW4(iVar12,-open) == iVar12 + open < 0) {
        uVar14 = CONCAT44(0,open) | 0x8000000000000000;
      }
      lVar23 = uVar14 + 1;
      iVar12 = matrix->max;
      local_120._8_8_ = lVar23;
      local_120._0_8_ = lVar23;
      local_120._16_8_ = lVar23;
      local_120._24_8_ = lVar23;
      local_1e0._8_8_ = lVar23;
      local_1e0._0_8_ = lVar23;
      local_1e0._16_8_ = lVar23;
      local_1e0._24_8_ = lVar23;
      local_1c0._8_8_ = lVar23;
      local_1c0._0_8_ = lVar23;
      local_1c0._16_8_ = lVar23;
      local_1c0._24_8_ = lVar23;
      local_160 = lVar23;
      lStack_158 = lVar23;
      lStack_150 = lVar23;
      lStack_148 = lVar23;
      ppVar13 = parasail_result_new();
      if (ppVar13 != (parasail_result_t *)0x0) {
        local_140._0_8_ = CONCAT44(0,open);
        ppVar13->flag = ppVar13->flag | 0x4801004;
        uVar14 = (ulong)(s2Len + 6);
        ptr = (undefined1 (*) [16])parasail_memalign_int64_t(0x20,uVar14);
        ptr_00 = parasail_memalign_int64_t(0x20,uVar14);
        ptr_01 = parasail_memalign_int64_t(0x20,uVar14);
        if (ptr_01 != (int64_t *)0x0 &&
            (ptr_00 != (int64_t *)0x0 && ptr != (undefined1 (*) [16])0x0)) {
          local_180._0_4_ = gap;
          uVar11 = (uint)uVar38;
          lVar36 = (long)(int)uVar11;
          if (matrix->type == 0) {
            iVar17 = uVar11 + 3;
            ptr_02 = parasail_memalign_int64_t(0x20,(long)iVar17);
            if (ptr_02 == (int64_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (0 < (int)uVar11) {
              piVar2 = matrix->mapper;
              uVar14 = 0;
              do {
                ptr_02[uVar14] = (long)piVar2[(byte)_s1[uVar14]];
                uVar14 = uVar14 + 1;
              } while (uVar38 != uVar14);
            }
            iVar9 = uVar11 + 1;
            if ((int)(uVar11 + 1) < iVar17) {
              iVar9 = iVar17;
            }
            memset(ptr_02 + lVar36,0,(ulong)(~uVar11 + iVar9) * 8 + 8);
          }
          else {
            ptr_02 = (int64_t *)0x0;
          }
          uVar29 = s2Len + 3;
          local_1a0 = 0x7ffffffffffffffe - (long)iVar12;
          auVar4._8_8_ = lStack_158;
          auVar4._0_8_ = local_160;
          auVar4._16_8_ = lStack_150;
          auVar4._24_8_ = lStack_148;
          local_c0 = vpblendd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar4,0x3f);
          local_80 = local_140._0_8_;
          uStack_78 = local_140._0_8_;
          uStack_70 = local_140._0_8_;
          uStack_68 = local_140._0_8_;
          local_180._4_4_ = 0;
          local_180._8_4_ = local_180._0_4_;
          local_180._12_4_ = 0;
          local_180._16_4_ = local_180._0_4_;
          local_180._20_4_ = 0;
          local_180._24_4_ = local_180._0_4_;
          local_180._28_4_ = 0;
          uVar14 = (ulong)(uint)s2Len;
          piVar2 = matrix->mapper;
          uVar24 = 1;
          if (1 < s2Len) {
            uVar24 = (ulong)(uint)s2Len;
          }
          uVar18 = 0;
          do {
            *(long *)(ptr[1] + uVar18 * 8 + 8) = (long)piVar2[(byte)_s2[uVar18]];
            uVar18 = uVar18 + 1;
          } while (uVar24 != uVar18);
          *ptr = (undefined1  [16])0x0;
          *(undefined8 *)ptr[1] = 0;
          uVar16 = s2Len + 1U;
          if ((int)(s2Len + 1U) < (int)uVar29) {
            uVar16 = uVar29;
          }
          uVar18 = 0;
          lStack_198 = local_1a0;
          lStack_190 = local_1a0;
          lStack_188 = local_1a0;
          local_e0 = lVar36;
          lStack_d8 = lVar36;
          lStack_d0 = lVar36;
          lStack_c8 = lVar36;
          local_a0 = uVar14;
          uStack_98 = uVar14;
          uStack_90 = uVar14;
          uStack_88 = uVar14;
          memset(ptr[1] + uVar14 * 8 + 8,0,(ulong)(~s2Len + uVar16) * 8 + 8);
          do {
            ptr_00[uVar18 + 3] = 0;
            ptr_01[uVar18 + 3] = lVar23;
            uVar18 = uVar18 + 1;
          } while (uVar24 != uVar18);
          lVar36 = 0;
          do {
            ptr_00[lVar36] = lVar23;
            ptr_01[lVar36] = lVar23;
            lVar36 = lVar36 + 1;
          } while (lVar36 != 3);
          lVar36 = uVar14 + 3;
          auVar63._8_8_ = lStack_158;
          auVar63._0_8_ = local_160;
          auVar63._16_8_ = lStack_150;
          auVar63._24_8_ = lStack_148;
          do {
            ptr_00[lVar36] = lVar23;
            ptr_01[lVar36] = lVar23;
            lVar36 = lVar36 + 1;
            s2Len = s2Len + 1;
          } while (s2Len < (int)uVar29);
          auVar48 = ZEXT3264(local_120);
          auVar49 = ZEXT3264(local_1c0);
          auVar50 = ZEXT3264(local_1e0);
          local_220 = auVar63;
          if ((int)uVar11 < 1) {
            local_2a0._8_8_ = lStack_198;
            local_2a0._0_8_ = local_1a0;
            local_2a0._16_8_ = lStack_190;
            local_2a0._24_8_ = lStack_188;
          }
          else {
            piVar2 = matrix->matrix;
            lVar36 = (long)matrix->size;
            iVar12 = matrix->type;
            uVar11 = uVar11 - 1;
            uVar14 = 1;
            if (1 < (int)uVar29) {
              uVar14 = (ulong)uVar29;
            }
            local_280._8_8_ = 2;
            local_280._0_8_ = 3;
            local_280._16_8_ = 1;
            local_280._24_8_ = 0;
            uVar24 = 0;
            local_100 = 4;
            uStack_f8 = 4;
            uStack_f0 = 4;
            uStack_e8 = 4;
            local_2a0._8_8_ = lStack_198;
            local_2a0._0_8_ = local_1a0;
            local_2a0._16_8_ = lStack_190;
            local_2a0._24_8_ = lStack_188;
            do {
              uVar18 = uVar24;
              if (iVar12 == 0) {
                uVar18 = ptr_02[uVar24];
              }
              uVar29 = (uint)uVar24;
              if (iVar12 == 0) {
                iVar19 = ptr_02[uVar24 | 1];
              }
              else {
                uVar16 = uVar29 | 1;
                if (uVar38 <= (uVar24 | 1)) {
                  uVar16 = uVar11;
                }
                iVar19 = (int64_t)(int)uVar16;
              }
              if (iVar12 == 0) {
                iVar21 = ptr_02[uVar24 | 2];
              }
              else {
                uVar16 = uVar29 | 2;
                if (uVar38 <= (uVar24 | 2)) {
                  uVar16 = uVar11;
                }
                iVar21 = (int64_t)(int)uVar16;
              }
              if (iVar12 == 0) {
                iVar25 = ptr_02[uVar24 | 3];
              }
              else {
                uVar29 = uVar29 | 3;
                if (uVar38 <= (uVar24 | 3)) {
                  uVar29 = uVar11;
                }
                iVar25 = (int64_t)(int)uVar29;
              }
              auVar8._8_8_ = lStack_d8;
              auVar8._0_8_ = local_e0;
              auVar8._16_8_ = lStack_d0;
              auVar8._24_8_ = lStack_c8;
              local_140 = vpcmpgtq_avx2(auVar8,local_280);
              uVar30 = 0;
              auVar7 = vpmovsxbq_avx2(ZEXT416(0xfffefd));
              auVar61 = auVar63;
              auVar5 = local_c0;
              auVar8 = auVar63;
              auVar4 = local_c0;
              do {
                auVar63 = vpermq_avx2(auVar5,0xf9);
                iVar1 = ptr_00[uVar30 + 3];
                auVar73._8_8_ = iVar1;
                auVar73._0_8_ = iVar1;
                auVar73._16_8_ = iVar1;
                auVar73._24_8_ = iVar1;
                auVar73 = vpblendd_avx2(auVar63,auVar73,0xc0);
                auVar63 = vpermq_avx2(auVar8,0xf9);
                iVar1 = ptr_01[uVar30 + 3];
                auVar74._8_8_ = iVar1;
                auVar74._0_8_ = iVar1;
                auVar74._16_8_ = iVar1;
                auVar74._24_8_ = iVar1;
                auVar8 = vpblendd_avx2(auVar63,auVar74,0xc0);
                auVar6._8_8_ = uStack_78;
                auVar6._0_8_ = local_80;
                auVar6._16_8_ = uStack_70;
                auVar6._24_8_ = uStack_68;
                auVar63 = vpsubq_avx2(auVar73,auVar6);
                auVar8 = vpsubq_avx2(auVar8,local_180);
                uVar15 = auVar8._0_8_;
                if ((long)auVar8._0_8_ < (long)auVar63._0_8_) {
                  uVar15 = auVar63._0_8_;
                }
                uVar22 = vpextrq_avx(auVar63._0_16_,1);
                uVar20 = vpextrq_avx(auVar8._0_16_,1);
                if ((long)uVar20 < (long)uVar22) {
                  uVar20 = uVar22;
                }
                uVar22 = auVar8._16_8_;
                if ((long)auVar8._16_8_ < (long)auVar63._16_8_) {
                  uVar22 = auVar63._16_8_;
                }
                uVar26 = vpextrq_avx(auVar63._16_16_,1);
                uVar37 = vpextrq_avx(auVar8._16_16_,1);
                if ((long)uVar37 < (long)uVar26) {
                  uVar37 = uVar26;
                }
                auVar63 = vpsubq_avx2(auVar5,auVar6);
                auVar8 = vpsubq_avx2(auVar61,local_180);
                uVar26 = auVar8._0_8_;
                if ((long)auVar8._0_8_ < (long)auVar63._0_8_) {
                  uVar26 = auVar63._0_8_;
                }
                uVar39 = vpextrq_avx(auVar63._0_16_,1);
                uVar27 = vpextrq_avx(auVar8._0_16_,1);
                if ((long)uVar27 < (long)uVar39) {
                  uVar27 = uVar39;
                }
                auVar66._8_8_ = 0;
                auVar66._0_8_ = (long)piVar2[uVar18 * lVar36 + *(long *)(ptr[1] + uVar30 * 8 + 8)];
                auVar70._8_8_ = 0;
                auVar70._0_8_ = (long)piVar2[iVar19 * lVar36 + *(long *)(ptr[1] + uVar30 * 8)];
                auVar66 = vpunpcklqdq_avx(auVar70,auVar66);
                auVar59._8_8_ = 0;
                auVar59._0_8_ = (long)piVar2[iVar25 * lVar36 + *(long *)(*ptr + uVar30 * 8)];
                auVar71._8_8_ = 0;
                auVar71._0_8_ = (long)piVar2[iVar21 * lVar36 + *(long *)(*ptr + uVar30 * 8 + 8)];
                auVar59 = vpunpcklqdq_avx(auVar59,auVar71);
                auVar61._0_16_ = ZEXT116(0) * auVar66 + ZEXT116(1) * auVar59;
                auVar61._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar66;
                auVar4 = vpaddq_avx2(auVar61,auVar4);
                uVar39 = auVar8._16_8_;
                if ((long)auVar8._16_8_ < (long)auVar63._16_8_) {
                  uVar39 = auVar63._16_8_;
                }
                uVar31 = vpextrq_avx(auVar63._16_16_,1);
                uVar34 = vpextrq_avx(auVar8._16_16_,1);
                if ((long)uVar34 < (long)uVar31) {
                  uVar34 = uVar31;
                }
                uVar31 = uVar26;
                if ((long)uVar26 < (long)auVar4._0_8_) {
                  uVar31 = auVar4._0_8_;
                }
                uVar32 = vpextrq_avx(auVar4._0_16_,1);
                uVar28 = uVar27;
                if ((long)uVar27 < (long)uVar32) {
                  uVar28 = uVar32;
                }
                uVar32 = uVar39;
                if ((long)uVar39 < (long)auVar4._16_8_) {
                  uVar32 = auVar4._16_8_;
                }
                uVar33 = vpextrq_avx(auVar4._16_16_,1);
                uVar35 = uVar34;
                if ((long)uVar34 < (long)uVar33) {
                  uVar35 = uVar33;
                }
                if ((long)uVar31 <= (long)uVar15) {
                  uVar31 = uVar15;
                }
                if ((long)uVar28 <= (long)uVar20) {
                  uVar28 = uVar20;
                }
                if ((long)uVar32 <= (long)uVar22) {
                  uVar32 = uVar22;
                }
                if ((long)uVar35 <= (long)uVar37) {
                  uVar35 = uVar37;
                }
                uVar31 = ~((long)uVar31 >> 0x3f) & uVar31;
                auVar51._8_8_ = 0;
                auVar51._0_8_ = uVar22;
                auVar62._8_8_ = 0;
                auVar62._0_8_ = uVar37;
                auVar66 = vpunpcklqdq_avx(auVar51,auVar62);
                auVar60._8_8_ = 0;
                auVar60._0_8_ = uVar20;
                auVar72._8_8_ = 0;
                auVar72._0_8_ = uVar15;
                auVar59 = vpunpcklqdq_avx(auVar72,auVar60);
                auVar54._0_16_ = ZEXT116(0) * auVar66 + ZEXT116(1) * auVar59;
                auVar54._16_16_ = ZEXT116(1) * auVar66;
                auVar56._8_8_ = 0;
                auVar56._0_8_ = uVar39;
                auVar68._8_8_ = 0;
                auVar68._0_8_ = uVar34;
                auVar66 = vpunpcklqdq_avx(auVar56,auVar68);
                auVar65._8_8_ = 0;
                auVar65._0_8_ = uVar27;
                auVar67._8_8_ = 0;
                auVar67._0_8_ = uVar26;
                auVar59 = vpunpcklqdq_avx(auVar67,auVar65);
                auVar69._0_16_ = ZEXT116(0) * auVar66 + ZEXT116(1) * auVar59;
                auVar69._16_16_ = ZEXT116(1) * auVar66;
                auVar40._8_8_ = 0;
                auVar40._0_8_ = ~((long)uVar32 >> 0x3f) & uVar32;
                auVar58._8_8_ = 0;
                auVar58._0_8_ = ~((long)uVar35 >> 0x3f) & uVar35;
                auVar66 = vpunpcklqdq_avx(auVar40,auVar58);
                auVar43._8_8_ = 0;
                auVar43._0_8_ = ~((long)uVar28 >> 0x3f) & uVar28;
                auVar64._8_8_ = 0;
                auVar64._0_8_ = uVar31;
                auVar59 = vpunpcklqdq_avx(auVar64,auVar43);
                auVar4 = vpcmpeqd_avx2(ZEXT832(uVar31),ZEXT832(uVar31));
                auVar57._0_16_ = ZEXT116(0) * auVar66 + ZEXT116(1) * auVar59;
                auVar57._16_16_ = ZEXT116(1) * auVar66;
                auVar75._0_8_ = -(ulong)(auVar7._0_8_ == auVar4._0_8_);
                auVar75._8_8_ = -(ulong)(auVar7._8_8_ == auVar4._8_8_);
                auVar75._16_8_ = -(ulong)(auVar7._16_8_ == auVar4._16_8_);
                auVar75._24_8_ = -(ulong)(auVar7._24_8_ == auVar4._24_8_);
                auVar5 = vpandn_avx2(auVar75,auVar57);
                auVar8 = vblendvpd_avx(auVar54,auVar63,auVar75);
                uVar15 = auVar5._0_8_;
                uVar20 = auVar5._16_8_;
                if (3 < uVar30) {
                  uVar22 = local_2a0._0_8_;
                  if ((long)uVar15 <= (long)local_2a0._0_8_) {
                    uVar22 = uVar15;
                  }
                  uVar26 = vpextrq_avx(local_2a0._0_16_,1);
                  uVar37 = vpextrq_avx(auVar5._0_16_,1);
                  if ((long)uVar37 <= (long)uVar26) {
                    uVar26 = uVar37;
                  }
                  uVar27 = local_2a0._16_8_;
                  if ((long)uVar20 <= (long)local_2a0._16_8_) {
                    uVar27 = uVar20;
                  }
                  uVar34 = vpextrq_avx(local_2a0._16_16_,1);
                  uVar39 = vpextrq_avx(auVar5._16_16_,1);
                  if ((long)uVar39 <= (long)uVar34) {
                    uVar34 = uVar39;
                  }
                  auVar41._8_8_ = 0;
                  auVar41._0_8_ = uVar34;
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = uVar27;
                  auVar66 = vpunpcklqdq_avx(auVar44,auVar41);
                  uVar27 = uVar15;
                  if ((long)uVar15 < (long)local_220._0_8_) {
                    uVar27 = local_220._0_8_;
                  }
                  uVar34 = vpextrq_avx(local_220._0_16_,1);
                  if ((long)uVar37 < (long)uVar34) {
                    uVar37 = uVar34;
                  }
                  uVar34 = uVar20;
                  if ((long)uVar20 < (long)local_220._16_8_) {
                    uVar34 = local_220._16_8_;
                  }
                  uVar31 = vpextrq_avx(local_220._16_16_,1);
                  auVar45._8_8_ = 0;
                  auVar45._0_8_ = uVar26;
                  auVar52._8_8_ = 0;
                  auVar52._0_8_ = uVar22;
                  auVar59 = vpunpcklqdq_avx(auVar52,auVar45);
                  if ((long)uVar39 < (long)uVar31) {
                    uVar39 = uVar31;
                  }
                  local_2a0._0_16_ = ZEXT116(0) * auVar66 + ZEXT116(1) * auVar59;
                  local_2a0._16_16_ = ZEXT116(1) * auVar66;
                  auVar42._8_8_ = 0;
                  auVar42._0_8_ = uVar39;
                  auVar46._8_8_ = 0;
                  auVar46._0_8_ = uVar34;
                  auVar66 = vpunpcklqdq_avx(auVar46,auVar42);
                  auVar47._8_8_ = 0;
                  auVar47._0_8_ = uVar37;
                  auVar53._8_8_ = 0;
                  auVar53._0_8_ = uVar27;
                  auVar59 = vpunpcklqdq_avx(auVar53,auVar47);
                  local_220._0_16_ = ZEXT116(0) * auVar66 + ZEXT116(1) * auVar59;
                  local_220._16_16_ = ZEXT116(1) * auVar66;
                }
                auVar6 = vpcmpgtq_avx2(auVar7,auVar4);
                auVar10._8_8_ = uStack_98;
                auVar10._0_8_ = local_a0;
                auVar10._16_8_ = uStack_90;
                auVar10._24_8_ = uStack_88;
                auVar61 = vpcmpgtq_avx2(auVar10,auVar7);
                auVar61 = vpand_avx2(auVar61,local_140);
                auVar6 = vpand_avx2(auVar61,auVar6);
                auVar66 = vpackssdw_avx(auVar6._0_16_,auVar6._16_16_);
                auVar55._0_8_ = -(ulong)(uVar15 == auVar48._0_8_);
                auVar55._8_8_ = -(ulong)(auVar5._8_8_ == auVar48._8_8_);
                auVar55._16_8_ = -(ulong)(uVar20 == auVar48._16_8_);
                auVar55._24_8_ = -(ulong)(auVar5._24_8_ == auVar48._24_8_);
                auVar54 = vpcmpgtq_avx2(auVar5,auVar48._0_32_);
                auVar61 = vpand_avx2(auVar54,auVar6);
                local_120 = vblendvpd_avx(auVar48._0_32_,auVar57,auVar61);
                auVar48 = ZEXT3264(local_120);
                auVar59 = vpackssdw_avx(auVar61._0_16_,auVar61._16_16_);
                auVar61 = vpcmpgtq_avx2(auVar49._0_32_,auVar7);
                auVar74 = vpand_avx2(auVar61,auVar55);
                auVar70 = vpackssdw_avx(auVar74._0_16_,auVar74._16_16_);
                auVar66 = vblendvps_avx(auVar59,auVar66,auVar70);
                auVar61 = vblendvpd_avx(auVar69,auVar63,auVar75);
                auVar57 = vpmovsxdq_avx2(auVar66);
                local_1e0 = vblendvpd_avx(auVar50._0_32_,local_280,auVar57);
                auVar50 = ZEXT3264(local_1e0);
                auVar74 = vpor_avx2(auVar74,auVar54);
                auVar6 = vpand_avx2(auVar6,auVar74);
                local_1c0 = vblendvpd_avx(auVar49._0_32_,auVar7,auVar6);
                auVar49 = ZEXT3264(local_1c0);
                ptr_00[uVar30] = uVar15;
                iVar1 = vmovlpd_avx(auVar8._0_16_);
                ptr_01[uVar30] = iVar1;
                auVar7 = vpsubq_avx2(auVar7,auVar4);
                uVar30 = uVar30 + 1;
                auVar4 = auVar73;
              } while (uVar14 != uVar30);
              auVar5._8_8_ = 4;
              auVar5._0_8_ = 4;
              auVar5._16_8_ = 4;
              auVar5._24_8_ = 4;
              local_280 = vpaddq_avx2(local_280,auVar5);
              uVar24 = uVar24 + 4;
            } while (uVar24 < uVar38);
          }
          lVar36 = 0;
          iVar12 = 0;
          iVar17 = 0;
          do {
            lVar3 = *(long *)(local_120 + lVar36 * 8);
            if (lVar23 < lVar3) {
              iVar12 = *(int *)(local_1e0 + lVar36 * 8);
              lVar23 = lVar3;
              iVar17 = *(int *)(local_1c0 + lVar36 * 8);
            }
            else if (lVar3 == lVar23) {
              lVar3 = *(long *)(local_1c0 + lVar36 * 8);
              if (lVar3 < iVar17) {
                iVar12 = *(int *)(local_1e0 + lVar36 * 8);
                iVar17 = (int)lVar3;
              }
              else if ((lVar3 == iVar17) && (*(long *)(local_1e0 + lVar36 * 8) < (long)iVar12)) {
                iVar12 = (int)*(long *)(local_1e0 + lVar36 * 8);
                iVar17 = (int)lVar3;
              }
            }
            lVar36 = lVar36 + 1;
          } while ((int)lVar36 != 4);
          auVar4 = vpcmpgtq_avx2(auVar63,local_2a0);
          auVar7._8_8_ = lStack_198;
          auVar7._0_8_ = local_1a0;
          auVar7._16_8_ = lStack_190;
          auVar7._24_8_ = lStack_188;
          auVar63 = vpcmpgtq_avx2(local_220,auVar7);
          auVar4 = vpor_avx2(auVar4,auVar63);
          if ((((auVar4 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               SUB321(auVar4 >> 0x7f,0) != '\0') || SUB321(auVar4 >> 0xbf,0) != '\0') ||
              auVar4[0x1f] < '\0') {
            *(byte *)&ppVar13->flag = (byte)ppVar13->flag | 0x40;
            lVar23 = 0;
            iVar17 = 0;
            iVar12 = 0;
          }
          ppVar13->score = (int)lVar23;
          ppVar13->end_query = iVar12;
          ppVar13->end_ref = iVar17;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(ptr_02);
            return ppVar13;
          }
          return ppVar13;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm256_set1_epi64x_rpl(open);
    vGap  = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_set1_epi64x_rpl(0);
    vOne = _mm256_set1_epi64x_rpl(1);
    vN = _mm256_set1_epi64x_rpl(N);
    vNegOne = _mm256_set1_epi64x_rpl(-1);
    vI = _mm256_set_epi64x_rpl(0,1,2,3);
    vJreset = _mm256_set_epi64x_rpl(0,-1,-2,-3);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi64x_rpl(s1Len);
    vJLimit = _mm256_set1_epi64x_rpl(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m256i vIltLimit = _mm256_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 8);
            vNH = _mm256_insert_epi64_rpl(vNH, H_pr[j], 3);
            vF = _mm256_srli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, F_pr[j], 3);
            vF = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vNH, vOpen),
                    _mm256_sub_epi64(vF, vGap));
            vE = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vWH, vOpen),
                    _mm256_sub_epi64(vE, vGap));
            vMat = _mm256_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm256_add_epi64(vNWH, vMat);
            vWH = _mm256_max_epi64_rpl(vNWH, vE);
            vWH = _mm256_max_epi64_rpl(vWH, vF);
            vWH = _mm256_max_epi64_rpl(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWH,0);
            F_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi64(vJ, vNegOne),
                        _mm256_cmplt_epi64_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi64(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi64(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_add_epi64(vJ, vOne);
        }
        vI = _mm256_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}